

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool __thiscall ON_NurbsCurve::Append(ON_NurbsCurve *this,ON_NurbsCurve *c)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  double *pdVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double knot;
  int sizeof_cv;
  int cv_dim;
  double *cv;
  int local_a8;
  int j;
  int i2;
  int i1;
  int i0;
  int c_knot_count;
  double dk;
  double w;
  double w1;
  double w0;
  undefined1 local_68 [8];
  ON_NurbsCurve tmp;
  bool rc;
  ON_NurbsCurve *c_local;
  ON_NurbsCurve *this_local;
  
  tmp.m_cv._7_1_ = 0;
  iVar3 = CVCount(this);
  if (iVar3 == 0) {
    operator=(this,c);
    iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])(this,0);
    this_local._7_1_ = (bool)(-(char)iVar3 & 1);
  }
  else {
    bVar1 = IsRational(c);
    if (((!bVar1) || (bVar1 = IsRational(this), bVar1)) || (bVar1 = MakeRational(this), bVar1)) {
      iVar3 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])();
      iVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])();
      if (iVar4 < iVar3) {
        iVar3 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])();
        bVar1 = IncreaseDegree(this,iVar3);
        if (!bVar1) {
          return false;
        }
      }
      iVar3 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
      iVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
      if (iVar4 < iVar3) {
        (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
        uVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x28])();
        if ((uVar5 & 1) == 0) {
          return false;
        }
      }
      bVar1 = IsRational(this);
      if ((!bVar1) || (bVar1 = IsRational(c), bVar1)) {
        iVar3 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])();
        iVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])();
        if ((iVar4 <= iVar3) && (bVar1 = IsClamped(c,0), bVar1)) {
          iVar3 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
          iVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                            ();
          if (iVar4 <= iVar3) {
            uVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])
                              (this,0);
            if (((uVar5 & 1) != 0) &&
               (uVar5 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])
                                  (c,0), (uVar5 & 1) != 0)) {
              iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                        [0x2c])();
              iVar4 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])
                                ();
              if (iVar3 == iVar4) {
                bVar1 = IsRational(this);
                bVar2 = IsRational(c);
                if (bVar1 == bVar2) {
                  iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                            [0x18])();
                  iVar4 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                            [0x18])();
                  if (iVar3 == iVar4) {
                    bVar1 = ClampEnd(this,1);
                    if (!bVar1) {
                      return false;
                    }
                    dVar8 = Weight(c,0);
                    iVar3 = CVCount(this);
                    dVar9 = Weight(this,iVar3 + -1);
                    dk = 1.0;
                    bVar1 = IsRational(this);
                    if ((bVar1) && ((dVar8 != dVar9 || (NAN(dVar8) || NAN(dVar9))))) {
                      dk = dVar9 / dVar8;
                    }
                    iVar3 = CVCount(this);
                    iVar4 = CVCount(c);
                    ReserveCVCapacity(this,(iVar3 + iVar4) * this->m_cv_stride);
                    iVar3 = Order(this);
                    iVar4 = CVCount(this);
                    iVar6 = CVCount(c);
                    iVar3 = ON_KnotCount(iVar3,iVar4 + iVar6);
                    ReserveKnotCapacity(this,iVar3);
                    iVar3 = CVCount(this);
                    dVar8 = Knot(this,iVar3 + -1);
                    iVar3 = Order(c);
                    dVar9 = Knot(c,iVar3 + -2);
                    iVar3 = KnotCount(c);
                    i2 = KnotCount(this);
                    iVar4 = CVCount(this);
                    _sizeof_cv = CV(this,iVar4 + -1);
                    iVar4 = CVSize(this);
                    local_a8 = 1;
                    iVar6 = Order(c);
                    for (j = iVar6 + -1; j < iVar3; j = j + 1) {
                      dVar10 = Knot(c,j);
                      dVar10 = dVar10 + (dVar8 - dVar9);
                      pdVar7 = this->m_knot;
                      iVar6 = Order(this);
                      if (pdVar7[(i2 - iVar6) + 1] <= dVar10 && dVar10 != pdVar7[(i2 - iVar6) + 1])
                      {
                        this->m_knot[i2] = dVar10;
                        _sizeof_cv = _sizeof_cv + this->m_cv_stride;
                        this->m_cv_count = this->m_cv_count + 1;
                        i2 = i2 + 1;
                      }
                      pdVar7 = CV(c,local_a8);
                      memcpy(_sizeof_cv,pdVar7,(long)(iVar4 << 3));
                      if ((dk != 1.0) || (NAN(dk))) {
                        for (cv._4_4_ = 0; cv._4_4_ < iVar4; cv._4_4_ = cv._4_4_ + 1) {
                          _sizeof_cv[cv._4_4_] = dk * _sizeof_cv[cv._4_4_];
                        }
                      }
                      local_a8 = local_a8 + 1;
                    }
                    tmp.m_cv._7_1_ = 1;
                  }
                }
              }
            }
            return (bool)(tmp.m_cv._7_1_ & 1);
          }
        }
      }
      ON_NurbsCurve((ON_NurbsCurve *)local_68,c);
      iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])();
      bVar1 = IncreaseDegree((ON_NurbsCurve *)local_68,iVar3);
      if (bVar1) {
        iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
        bVar1 = ChangeDimension((ON_NurbsCurve *)local_68,iVar3);
        if (bVar1) {
          bVar1 = IsRational(this);
          if ((!bVar1) || (bVar1 = MakeRational((ON_NurbsCurve *)local_68), bVar1)) {
            bVar1 = ClampEnd((ON_NurbsCurve *)local_68,0);
            if (bVar1) {
              bVar1 = IsRational((ON_NurbsCurve *)local_68);
              bVar2 = IsRational(this);
              if (bVar1 == bVar2) {
                iVar3 = Degree((ON_NurbsCurve *)local_68);
                iVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                          [0x2c])();
                if (iVar3 == iVar4) {
                  iVar3 = Dimension((ON_NurbsCurve *)local_68);
                  iVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                            [0x18])();
                  if (iVar3 == iVar4) {
                    bVar1 = IsClamped((ON_NurbsCurve *)local_68,0);
                    if (bVar1) {
                      this_local._7_1_ = Append(this,(ON_NurbsCurve *)local_68);
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
      ~ON_NurbsCurve((ON_NurbsCurve *)local_68);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsCurve::Append( const ON_NurbsCurve& c )
{
  bool rc = false;

  if ( CVCount() == 0 ) {
    *this = c;
    return IsValid()?true:false;
  }

  if ( c.IsRational() && !IsRational() ) {
    if ( !MakeRational() )
      return false;
  }
  if ( c.Degree() > Degree() ) {
    if ( !IncreaseDegree( c.Degree() ) )
      return false;
  }
  if ( c.Dimension() > Dimension() ) {
    if ( !ChangeDimension( c.Dimension() ) )
      return false;
  }

  if (    (IsRational() && !c.IsRational())
       || c.Degree() < Degree() 
       || !c.IsClamped(0) 
       || c.Dimension() < Dimension() ) 
  {
    ON_NurbsCurve tmp(c);
    if ( !tmp.IncreaseDegree( Degree() ) )
      return false;
    if ( !tmp.ChangeDimension( Dimension() ) )
      return false;
    if ( IsRational() ) {
      if ( !tmp.MakeRational() )
        return false;
    }
    if ( !tmp.ClampEnd(0) )
      return false;

    // make sure we don't reenter this scope
    if ( tmp.IsRational() != IsRational() )
      return false;
    if ( tmp.Degree() != Degree() )
      return false;
    if ( tmp.Dimension() != Dimension() )
      return false;
    if ( !tmp.IsClamped(0) )
      return false;
    return Append(tmp);
  }

  if (    IsValid() 
       && c.IsValid() 
       && Degree() == c.Degree() 
       && IsRational() == c.IsRational() 
       && Dimension() == c.Dimension() ) 
  {
    if ( !ClampEnd(1) )
      return false;
    const double w0 = c.Weight(0);
    const double w1 = Weight(CVCount()-1);
    double w = 1.0;
    if ( IsRational() && w0 != w1 ) {
      w = w1/w0;
    }
    ReserveCVCapacity( (CVCount()+c.CVCount())*m_cv_stride );
    ReserveKnotCapacity( ON_KnotCount(Order(),CVCount()+c.CVCount()) );
    const double dk = Knot(CVCount()-1) - c.Knot(c.Order()-2);


    //const int c_cv_count = c.CVCount();
    const int c_knot_count = c.KnotCount();
    int i0, i1, i2, j;

		// i0 and cv index into m_knot and m_cv respectively 
		i0 = KnotCount();
		double* cv = CV(CVCount() - 1);
		const int cv_dim = CVSize();
		const int sizeof_cv = cv_dim * sizeof(*cv);

		// i1 and i2 index c's knots and cvs respectively
		i2 = 1;
		for ( i1 = c.Order()-1; i1 < c_knot_count; i1++, i2++ ) {
			double knot = c.Knot(i1) + dk;
			// GBA 20-April-2017  Check for span collapse
			if (knot > m_knot[i0 - Order() + 1])
			{
				m_knot[i0++] = knot;
				cv += m_cv_stride;
				m_cv_count++;
			}
			memcpy(cv, c.CV(i2), sizeof_cv);
			if (w != 1.0) {
				for (j = 0; j < cv_dim; j++)
					cv[j] *= w;
			}	
		}

    rc = true;
  }
  return rc;
}